

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[32],kj::CappedArray<char,17ul>,char_const(&)[4],unsigned_long&,kj::StringTree>
          (String *__return_storage_ptr__,kj *this,char (*params) [32],
          CappedArray<char,_17UL> *params_1,char (*params_2) [4],unsigned_long *params_3,
          StringTree *params_4)

{
  char (*value) [32];
  CappedArray<char,_17UL> *value_00;
  char (*value_01) [4];
  kj *this_00;
  StringTree *pSVar1;
  unsigned_long *value_02;
  StringTree *in_stack_ffffffffffffff58;
  CappedArray<char,_26UL> local_90;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  NoInfer<kj::StringTree> *local_38;
  StringTree *params_local_4;
  unsigned_long *params_local_3;
  char (*params_local_2) [4];
  CappedArray<char,_17UL> *params_local_1;
  char (*params_local) [32];
  
  local_38 = (NoInfer<kj::StringTree> *)params_3;
  params_local_4 = (StringTree *)params_2;
  params_local_3 = &params_1->currentSize;
  params_local_2 = (char (*) [4])params;
  params_local_1 = (CappedArray<char,_17UL> *)this;
  params_local = (char (*) [32])__return_storage_ptr__;
  value = ::const((char (*) [32])this);
  local_48 = toCharSequence<char_const(&)[32]>(value);
  value_00 = fwd<kj::CappedArray<char,17ul>>
                       ((NoInfer<kj::CappedArray<char,_17UL>_> *)params_local_2);
  local_58 = toCharSequence<kj::CappedArray<char,17ul>>(value_00);
  value_01 = ::const((char (*) [4])params_local_3);
  local_68 = toCharSequence<char_const(&)[4]>(value_01);
  this_00 = (kj *)fwd<unsigned_long&>(&params_local_4->size_);
  toCharSequence<unsigned_long&>(&local_90,this_00,value_02);
  pSVar1 = fwd<kj::StringTree>(local_38);
  pSVar1 = toCharSequence<kj::StringTree>(pSVar1);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::StringTree>
            (__return_storage_ptr__,(_ *)&local_48,&local_58,&local_68,
             (ArrayPtr<const_char> *)&local_90,(CappedArray<char,_26UL> *)pSVar1,
             in_stack_ffffffffffffff58);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}